

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

bool __thiscall bloaty::RangeMap::TryGetSize(RangeMap *this,uint64_t addr,uint64_t *size)

{
  const_iterator this_00;
  pointer ppVar1;
  uint64_t *in_RDX;
  map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
  *in_RDI;
  const_iterator iter;
  _Self local_28;
  uint64_t *local_20;
  bool local_1;
  
  local_20 = in_RDX;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::find(in_RDI,(key_type *)0x1c5896);
  this_00 = std::
            map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
            ::end(in_RDI);
  local_1 = std::operator==(&local_28,(_Self *)&stack0xffffffffffffffd0);
  if (!local_1) {
    ppVar1 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           *)this_00._M_node);
    *local_20 = (ppVar1->second).size;
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool RangeMap::TryGetSize(uint64_t addr, uint64_t* size) const {
  auto iter = mappings_.find(addr);
  if (iter == mappings_.end()) {
    return false;
  } else {
    *size = iter->second.size;
    return true;
  }
}